

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Offset<reflection::Enum> __thiscall
flatbuffers::EnumDef::Serialize(EnumDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  string_view str;
  bool bVar1;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_> values;
  Offset<reflection::Type> underlying_type;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attributes;
  Offset<flatbuffers::String> declaration_file;
  Offset<reflection::Enum> OVar2;
  reference ppEVar3;
  allocator<char> local_c1;
  Offset<flatbuffers::String> file__;
  string decl_file_in_project;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> docs__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attr__;
  Offset<reflection::Type> type__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_> vals__;
  Offset<flatbuffers::String> name__;
  string qualified_name;
  value_type local_54;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_50;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_48;
  const_iterator it;
  vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  enumval_offsets;
  Parser *parser_local;
  FlatBufferBuilder *builder_local;
  EnumDef *this_local;
  
  std::
  vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  ::vector((vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
            *)&it);
  local_48._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                 (&(this->vals).vec);
  while( true ) {
    local_50._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                   (&(this->vals).vec);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_48);
    local_54.o = (offset_type)EnumVal::Serialize(*ppEVar3,builder,parser);
    std::
    vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
    ::push_back((vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
                 *)&it,&local_54);
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_48);
  }
  Namespace::GetFullyQualifiedName
            ((string *)&vals__,(this->super_Definition).defined_namespace,(string *)this,1000);
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,(string *)&vals__);
  values = FlatBufferBuilderImpl<false>::
           CreateVector<flatbuffers::Offset<reflection::EnumVal>,std::allocator<flatbuffers::Offset<reflection::EnumVal>>>
                     (builder,(vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
                               *)&it);
  underlying_type = Type::Serialize(&this->underlying_type,builder);
  attributes = Definition::SerializeAttributes(&this->super_Definition,builder,parser);
  if ((((parser->opts).binary_schema_comments & 1U) == 0) ||
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&(this->super_Definition).doc_comment), bVar1)) {
    Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                *)((long)&decl_file_in_project.field_2 + 0xc),0);
  }
  else {
    decl_file_in_project.field_2._12_4_ =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (builder,&(this->super_Definition).doc_comment);
  }
  if ((this->super_Definition).declaration_file == (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&file__,"",&local_c1);
    std::allocator<char>::~allocator(&local_c1);
  }
  else {
    std::__cxx11::string::string
              ((string *)&file__,(string *)(this->super_Definition).declaration_file);
  }
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&file__);
  declaration_file = FlatBufferBuilderImpl<false>::CreateSharedString(builder,str);
  OVar2 = reflection::CreateEnum
                    (builder,name,values,(bool)(this->is_union & 1),underlying_type,attributes,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                      )decl_file_in_project.field_2._12_4_,declaration_file);
  std::__cxx11::string::~string((string *)&file__);
  std::__cxx11::string::~string((string *)&vals__);
  std::
  vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  ::~vector((vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
             *)&it);
  return (Offset<reflection::Enum>)OVar2.o;
}

Assistant:

Offset<reflection::Enum> EnumDef::Serialize(FlatBufferBuilder *builder,
                                            const Parser &parser) const {
  std::vector<Offset<reflection::EnumVal>> enumval_offsets;
  for (auto it = vals.vec.begin(); it != vals.vec.end(); ++it) {
    enumval_offsets.push_back((*it)->Serialize(builder, parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto vals__ = builder->CreateVector(enumval_offsets);
  const auto type__ = underlying_type.Serialize(builder);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateEnum(*builder, name__, vals__, is_union, type__,
                                attr__, docs__, file__);
}